

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

int Wlc_NtkTraceCheckConfict(Wlc_Ntk_t *p,Vec_Int_t *vTrace,Vec_Int_t *vMemObjs,Vec_Wrd_t *vValues)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int i;
  int iVar6;
  Wlc_Obj_t *pObj;
  Wlc_Obj_t *pObj_00;
  word wVar7;
  word wVar8;
  int iIndFirst;
  int iNumFirst;
  int iFrmFirst;
  int iObjFirst;
  int iIndLast;
  int iNumLast;
  int iFrmLast;
  int iObjLast;
  Wlc_Obj_t *pObjFirst;
  Wlc_Obj_t *pObjLast;
  Vec_Wrd_t *vValues_local;
  Vec_Int_t *vMemObjs_local;
  Vec_Int_t *vTrace_local;
  Wlc_Ntk_t *p_local;
  
  iVar1 = Vec_IntEntryLast(vTrace);
  iVar1 = iVar1 >> 0xb;
  iVar2 = Vec_IntEntryLast(vTrace);
  iVar3 = Wlc_ObjCopy(p,iVar1);
  iVar4 = Vec_IntSize(vMemObjs);
  iVar2 = ((iVar2 >> 1 & 0x3ffU) * iVar4 + iVar3) * 3;
  iVar4 = Vec_IntEntry(vTrace,0);
  iVar4 = iVar4 >> 0xb;
  iVar5 = Vec_IntEntry(vTrace,0);
  i = Wlc_ObjCopy(p,iVar4);
  iVar6 = Vec_IntSize(vMemObjs);
  iVar5 = ((iVar5 >> 1 & 0x3ffU) * iVar6 + i) * 3;
  iVar6 = Vec_IntSize(vTrace);
  if (iVar6 < 2) {
    __assert_fail("Vec_IntSize(vTrace) >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                  ,0x346,
                  "int Wlc_NtkTraceCheckConfict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *)"
                 );
  }
  iVar3 = Vec_IntEntry(vMemObjs,iVar3);
  if (iVar1 != iVar3) {
    __assert_fail("iObjLast == Vec_IntEntry(vMemObjs, iNumLast)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                  ,0x347,
                  "int Wlc_NtkTraceCheckConfict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *)"
                 );
  }
  iVar3 = Vec_IntEntry(vMemObjs,i);
  if (iVar4 != iVar3) {
    __assert_fail("iObjFirst == Vec_IntEntry(vMemObjs, iNumFirst)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                  ,0x348,
                  "int Wlc_NtkTraceCheckConfict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *)"
                 );
  }
  pObj = Wlc_NtkObj(p,iVar1);
  pObj_00 = Wlc_NtkObj(p,iVar4);
  iVar1 = Wlc_ObjType(pObj);
  if (iVar1 == 0x36) {
    iVar1 = Wlc_ObjType(pObj_00);
    if (iVar1 != 0x37) {
      iVar1 = Wlc_ObjIsPi(pObj_00);
      if (iVar1 == 0) {
        __assert_fail("Wlc_ObjType(pObjFirst) == WLC_OBJ_WRITE || Wlc_ObjIsPi(pObjFirst)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                      ,0x34c,
                      "int Wlc_NtkTraceCheckConfict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *)"
                     );
      }
    }
    iVar1 = Wlc_ObjIsPi(pObj_00);
    if (iVar1 == 0) {
      wVar7 = Vec_WrdEntry(vValues,iVar2 + 1);
      wVar8 = Vec_WrdEntry(vValues,iVar5 + 1);
      if (wVar7 != wVar8) {
        __assert_fail("Vec_WrdEntry(vValues, iIndLast + 1) == Vec_WrdEntry(vValues, iIndFirst + 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                      ,0x34f,
                      "int Wlc_NtkTraceCheckConfict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *)"
                     );
      }
      wVar7 = Vec_WrdEntry(vValues,iVar2 + 2);
      wVar8 = Vec_WrdEntry(vValues,iVar5 + 2);
      p_local._4_4_ = (uint)(wVar7 != wVar8);
    }
    else {
      p_local._4_4_ = 0;
    }
    return p_local._4_4_;
  }
  __assert_fail("Wlc_ObjType(pObjLast) == WLC_OBJ_READ",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                ,0x34b,
                "int Wlc_NtkTraceCheckConfict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *)");
}

Assistant:

int Wlc_NtkTraceCheckConfict( Wlc_Ntk_t * p, Vec_Int_t * vTrace, Vec_Int_t * vMemObjs, Vec_Wrd_t * vValues )
{
    Wlc_Obj_t * pObjLast, * pObjFirst; 
    int iObjLast = Vec_IntEntryLast(vTrace) >> 11;
    int iFrmLast =(Vec_IntEntryLast(vTrace) >> 1) & 0x3FF;
    int iNumLast = Wlc_ObjCopy( p, iObjLast );
    int iIndLast = 3*(iFrmLast*Vec_IntSize(vMemObjs) + iNumLast);
    int iObjFirst = Vec_IntEntry(vTrace, 0) >> 11;
    int iFrmFirst =(Vec_IntEntry(vTrace, 0) >> 1) & 0x3FF;
    int iNumFirst = Wlc_ObjCopy( p, iObjFirst );
    int iIndFirst = 3*(iFrmFirst*Vec_IntSize(vMemObjs) + iNumFirst);
    assert( Vec_IntSize(vTrace) >= 2 );
    assert( iObjLast  == Vec_IntEntry(vMemObjs, iNumLast) );
    assert( iObjFirst == Vec_IntEntry(vMemObjs, iNumFirst) );
    pObjLast  = Wlc_NtkObj(p, iObjLast);
    pObjFirst = Wlc_NtkObj(p, iObjFirst);
    assert( Wlc_ObjType(pObjLast) == WLC_OBJ_READ );
    assert( Wlc_ObjType(pObjFirst) == WLC_OBJ_WRITE || Wlc_ObjIsPi(pObjFirst) );
    if ( Wlc_ObjIsPi(pObjFirst) )
        return 0;
    assert( Vec_WrdEntry(vValues, iIndLast + 1) == Vec_WrdEntry(vValues, iIndFirst + 1) ); // equal addr
    return Vec_WrdEntry(vValues, iIndLast + 2) != Vec_WrdEntry(vValues, iIndFirst + 2); // diff data
}